

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O0

int firstpass_inter_prediction
              (AV1_COMP *cpi,ThreadData_conflict *td,YV12_BUFFER_CONFIG *last_frame,
              YV12_BUFFER_CONFIG *golden_frame,int unit_row,int unit_col,int recon_yoffset,
              int recon_uvoffset,int src_yoffset,BLOCK_SIZE fp_block_size,int this_intra_error,
              int raw_motion_err_counts,int *raw_motion_err_list,MV ref_mv,MV *best_mv,
              MV *last_non_zero_mv,FRAME_STATS *stats)

{
  byte bVar1;
  BLOCK_SIZE bsize_00;
  uint uVar2;
  int mi_row;
  int iVar3;
  MV MVar4;
  CommonModeInfoParams *mi_params_00;
  AV1_COMMON *cm_00;
  scale_factors *sf;
  int iVar5;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  BLOCK_SIZE in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  FULLPEL_MV tmp_mv_1;
  int gf_motion_error;
  int tmp_err;
  FULLPEL_MV tmp_mv;
  FIRST_PASS_SPEED_FEATURES *fp_sf;
  int raw_motion_error;
  buf_2d unscaled_last_source_buf_2d;
  int motion_error;
  FULLPEL_MV mv;
  int unit_cols;
  int unit_rows;
  int unit_width;
  int fp_block_size_height;
  BLOCK_SIZE bsize;
  int unit_scale;
  int bitdepth;
  int is_high_bitdepth;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  CurrentFrame *current_frame;
  CommonModeInfoParams *mi_params;
  AV1_COMMON *cm;
  FULLPEL_MV *in_stack_000000c8;
  int this_inter_error;
  buf_2d *in_stack_ffffffffffffff08;
  undefined4 uVar6;
  buf_2d *ref;
  buf_2d *in_stack_ffffffffffffff10;
  BLOCK_SIZE bsize_01;
  int in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff20;
  AV1_COMP *cpi_00;
  double local_d8;
  MV *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  undefined1 local_c0 [7];
  int in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int local_80;
  FULLPEL_MV local_7c;
  int local_78;
  int local_74;
  int local_2c;
  
  local_2c = in_stack_00000028;
  mi_params_00 = (CommonModeInfoParams *)(in_RDI + 0x3c188);
  is_cur_buf_hbd((MACROBLOCKD *)(in_RSI + 0x1a0));
  get_bsize(mi_params_00,in_stack_00000020,in_R8D,in_R9D);
  bVar1 = block_size_wide[in_stack_00000020];
  uVar2 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                [in_stack_00000020];
  local_74 = get_unit_rows(in_stack_00000020,mi_params_00->mb_rows);
  local_78 = get_unit_cols(in_stack_00000020,*(int *)(in_RDI + 0x3c18c));
  memset(&local_7c,0,4);
  *(long *)(in_RSI + 0x1e0) = *(long *)(in_RDX + 0x28) + (long)in_stack_00000008;
  av1_set_mv_col_limits
            (mi_params_00,(FullMvLimits *)(in_RSI + 0x1f6e4),in_R9D * uVar2,(int)(uint)bVar1 >> 2,
             *(int *)(in_RDI + 0x42724));
  local_80 = get_prediction_error_bitdepth
                       (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                        (BLOCK_SIZE)((uint)in_stack_ffffffffffffff18 >> 0x18),
                        in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  cm_00 = (AV1_COMMON *)(*(long *)(*(long *)(in_RDI + 0x42890) + 0x28) + (long)in_stack_00000018);
  iVar5 = *(int *)(*(long *)(in_RDI + 0x42890) + 0x20);
  mi_row = get_prediction_error_bitdepth
                     (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                      (BLOCK_SIZE)((uint)in_stack_ffffffffffffff18 >> 0x18),
                      in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  *(int *)(_tmp_mv_1 + (long)in_stack_00000030 * 4) = mi_row;
  sf = (scale_factors *)(in_RDI + 0x608f4);
  if (((*(int *)(in_RDI + 0x608f8) < mi_row) &&
      (first_pass_motion_search
                 ((AV1_COMP *)last_frame,(MACROBLOCK *)golden_frame,
                  (MV *)CONCAT44(unit_row,unit_col),in_stack_000000c8,(int *)cm), sf->y_step_q4 == 0
      )) && (iVar3 = is_zero_mv((MV *)&tmp_err), iVar3 == 0)) {
    memset(&stack0xffffffffffffff4c,0,4);
    in_stack_ffffffffffffff48 = 0x7fffffff;
    first_pass_motion_search
              ((AV1_COMP *)last_frame,(MACROBLOCK *)golden_frame,(MV *)CONCAT44(unit_row,unit_col),
               in_stack_000000c8,(int *)cm);
    if (in_stack_ffffffffffffff48 < local_80) {
      local_80 = in_stack_ffffffffffffff48;
    }
  }
  stack0xffffffffffffff44 = local_80;
  if ((1 < *(uint *)(in_RDI + 0x3bf90)) && (in_RCX != 0)) {
    memset(local_c0,0,4);
    ref = (buf_2d *)CONCAT44(uVar6,1);
    av1_setup_pre_planes
              ((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff6c,(YV12_BUFFER_CONFIG *)cm_00,mi_row,
               in_stack_ffffffffffffff58,sf,uVar2);
    *(long *)(in_RSI + 0x1e0) = *(long *)(in_RSI + 0x1e0) + (long)in_stack_00000008;
    register0x00000000 =
         get_prediction_error_bitdepth
                   (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                    (BLOCK_SIZE)((uint)in_stack_ffffffffffffff18 >> 0x18),in_stack_ffffffffffffff10,
                    ref);
    first_pass_motion_search
              ((AV1_COMP *)last_frame,(MACROBLOCK *)golden_frame,(MV *)CONCAT44(unit_row,unit_col),
               in_stack_000000c8,(int *)cm);
  }
  bsize_01 = (BLOCK_SIZE)((ulong)in_stack_ffffffffffffff10 >> 0x38);
  if ((stack0xffffffffffffff44 < local_80) && (stack0xffffffffffffff44 < in_stack_00000028)) {
    *(int *)(unscaled_last_source_buf_2d.buf + 0x28) =
         *(int *)(unscaled_last_source_buf_2d.buf + 0x28) + 1;
  }
  if ((*(uint *)(in_RDI + 0x3bf90) < 2) || (in_RCX == 0)) {
    *(long *)(unscaled_last_source_buf_2d.buf + 0x18) =
         (long)local_80 + *(long *)(unscaled_last_source_buf_2d.buf + 0x18);
  }
  else {
    in_stack_ffffffffffffff38 = in_stack_00000028;
    if (stack0xffffffffffffff44 < in_stack_00000028) {
      in_stack_ffffffffffffff38 = stack0xffffffffffffff44;
    }
    *(long *)(unscaled_last_source_buf_2d.buf + 0x18) =
         (long)in_stack_ffffffffffffff38 + *(long *)(unscaled_last_source_buf_2d.buf + 0x18);
  }
  *(long *)(in_RSI + 0x1e0) = *(long *)(in_RDX + 0x28) + (long)in_stack_00000008;
  iVar3 = av1_num_planes((AV1_COMMON *)(in_RDI + 0x3bf80));
  if (1 < iVar3) {
    *(long *)(in_RSI + 0xc10) = *(long *)(in_RDX + 0x30) + (long)in_stack_00000010;
    *(long *)(in_RSI + 0x1640) = *(long *)(in_RDX + 0x38) + (long)in_stack_00000010;
  }
  fp_sf->reduce_mv_step_param = 0;
  if (local_80 <= in_stack_00000028) {
    iVar3 = (in_stack_00000028 + -0x400) * 9;
    if ((iVar3 == local_80 * 10 || SBORROW4(iVar3,local_80 * 10) != iVar3 + local_80 * -10 < 0) &&
       (in_stack_00000028 < 0x800)) {
      *(double *)(unscaled_last_source_buf_2d.buf + 0x30) =
           *(double *)(unscaled_last_source_buf_2d.buf + 0x30) + 1.0;
    }
    else if ((0x2000 < in_stack_00000028) &&
            (SBORROW4(in_stack_00000028,local_80 * 3) != in_stack_00000028 + local_80 * -3 < 0)) {
      in_stack_ffffffffffffff30 = (MV *)(double)local_80;
      if (0.0 <= (double)in_stack_00000028) {
        local_d8 = (double)in_stack_00000028 + 1e-06;
      }
      else {
        local_d8 = (double)in_stack_00000028 - 1e-06;
      }
      *(double *)(unscaled_last_source_buf_2d.buf + 0x30) =
           (double)in_stack_ffffffffffffff30 / local_d8 +
           *(double *)(unscaled_last_source_buf_2d.buf + 0x30);
    }
    cpi_00 = (AV1_COMP *)fp_sf;
    MVar4 = get_mv_from_fullmv(&local_7c);
    iVar3 = stack0xffffffffffffff44;
    *(MV *)&cpi_00->ppi = MVar4;
    local_2c = local_80;
    *(undefined1 *)(**(long **)(in_RSI + 0x2058) + 2) = 0x10;
    *(int *)(**(long **)(in_RSI + 0x2058) + 8) = fp_sf->reduce_mv_step_param;
    *(undefined1 *)(**(long **)(in_RSI + 0x2058) + 0x91) = 0;
    *(undefined1 *)(**(long **)(in_RSI + 0x2058) + 0x10) = 1;
    *(undefined1 *)(**(long **)(in_RSI + 0x2058) + 0x11) = 0xff;
    if (sf->x_step_q4 == 0) {
      uVar2 = (uint)stack0xffffffffffffff44 >> 0x18;
      bsize_00 = (BLOCK_SIZE)uVar2;
      unique0x10000696 = iVar3;
      av1_enc_build_inter_predictor
                (cm_00,(MACROBLOCKD *)CONCAT44(mi_row,in_stack_ffffffffffffff58),
                 (int)((ulong)sf >> 0x20),(int)sf,
                 (BUFFER_SET *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                 bsize_00,in_stack_ffffffffffffff70,iVar5);
      av1_encode_sby_pass1
                (cpi_00,(MACROBLOCK *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                 bsize_01);
    }
    *(int *)(unscaled_last_source_buf_2d.buf + 0x48) =
         (int)(short)fp_sf->reduce_mv_step_param + *(int *)(unscaled_last_source_buf_2d.buf + 0x48);
    iVar5 = (int)(short)fp_sf->reduce_mv_step_param;
    if (iVar5 < 1) {
      iVar5 = -iVar5;
    }
    *(int *)(unscaled_last_source_buf_2d.buf + 0x50) =
         iVar5 + *(int *)(unscaled_last_source_buf_2d.buf + 0x50);
    *(int *)(unscaled_last_source_buf_2d.buf + 0x4c) =
         (int)*(short *)((long)&fp_sf->reduce_mv_step_param + 2) +
         *(int *)(unscaled_last_source_buf_2d.buf + 0x4c);
    iVar5 = (int)*(short *)((long)&fp_sf->reduce_mv_step_param + 2);
    if (iVar5 < 1) {
      iVar5 = -iVar5;
    }
    *(int *)(unscaled_last_source_buf_2d.buf + 0x54) =
         iVar5 + *(int *)(unscaled_last_source_buf_2d.buf + 0x54);
    *(long *)(unscaled_last_source_buf_2d.buf + 0x58) =
         (long)((int)(short)fp_sf->reduce_mv_step_param * (int)(short)fp_sf->reduce_mv_step_param) +
         *(long *)(unscaled_last_source_buf_2d.buf + 0x58);
    *(long *)(unscaled_last_source_buf_2d.buf + 0x60) =
         (long)((int)*(short *)((long)&fp_sf->reduce_mv_step_param + 2) *
               (int)*(short *)((long)&fp_sf->reduce_mv_step_param + 2)) +
         *(long *)(unscaled_last_source_buf_2d.buf + 0x60);
    *(int *)(unscaled_last_source_buf_2d.buf + 0x24) =
         *(int *)(unscaled_last_source_buf_2d.buf + 0x24) + 1;
    accumulate_mv_stats(SUB84((ulong)cpi_00 >> 0x20,0),SUB84(cpi_00,0),in_stack_ffffffffffffff1c,
                        in_stack_ffffffffffffff18,
                        (int)((ulong)unscaled_last_source_buf_2d.buf >> 0x20),
                        (int)unscaled_last_source_buf_2d.buf,in_stack_ffffffffffffff30,
                        (FRAME_STATS *)CONCAT44(MVar4,in_stack_ffffffffffffff38));
  }
  return local_2c;
}

Assistant:

static int firstpass_inter_prediction(
    AV1_COMP *cpi, ThreadData *td, const YV12_BUFFER_CONFIG *const last_frame,
    const YV12_BUFFER_CONFIG *const golden_frame, const int unit_row,
    const int unit_col, const int recon_yoffset, const int recon_uvoffset,
    const int src_yoffset, const BLOCK_SIZE fp_block_size,
    const int this_intra_error, const int raw_motion_err_counts,
    int *raw_motion_err_list, const MV ref_mv, MV *best_mv,
    MV *last_non_zero_mv, FRAME_STATS *stats) {
  int this_inter_error = this_intra_error;
  AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  CurrentFrame *const current_frame = &cm->current_frame;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  const int is_high_bitdepth = is_cur_buf_hbd(xd);
  const int bitdepth = xd->bd;
  const int unit_scale = mi_size_wide[fp_block_size];
  const BLOCK_SIZE bsize =
      get_bsize(mi_params, fp_block_size, unit_row, unit_col);
  const int fp_block_size_height = block_size_wide[fp_block_size];
  const int unit_width = mi_size_wide[fp_block_size];
  const int unit_rows = get_unit_rows(fp_block_size, mi_params->mb_rows);
  const int unit_cols = get_unit_cols(fp_block_size, mi_params->mb_cols);
  // Assume 0,0 motion with no mv overhead.
  FULLPEL_MV mv = kZeroFullMv;
  xd->plane[0].pre[0].buf = last_frame->y_buffer + recon_yoffset;
  // Set up limit values for motion vectors to prevent them extending
  // outside the UMV borders.
  av1_set_mv_col_limits(mi_params, &x->mv_limits, unit_col * unit_width,
                        fp_block_size_height >> MI_SIZE_LOG2,
                        cpi->oxcf.border_in_pixels);

  int motion_error =
      get_prediction_error_bitdepth(is_high_bitdepth, bitdepth, bsize,
                                    &x->plane[0].src, &xd->plane[0].pre[0]);

  // Compute the motion error of the 0,0 motion using the last source
  // frame as the reference. Skip the further motion search on
  // reconstructed frame if this error is small.
  // TODO(chiyotsai): The unscaled last source might be different dimension
  // as the current source. See BUG=aomedia:3413
  struct buf_2d unscaled_last_source_buf_2d;
  unscaled_last_source_buf_2d.buf =
      cpi->unscaled_last_source->y_buffer + src_yoffset;
  unscaled_last_source_buf_2d.stride = cpi->unscaled_last_source->y_stride;
  const int raw_motion_error = get_prediction_error_bitdepth(
      is_high_bitdepth, bitdepth, bsize, &x->plane[0].src,
      &unscaled_last_source_buf_2d);
  raw_motion_err_list[raw_motion_err_counts] = raw_motion_error;
  const FIRST_PASS_SPEED_FEATURES *const fp_sf = &cpi->sf.fp_sf;

  if (raw_motion_error > fp_sf->skip_motion_search_threshold) {
    // Test last reference frame using the previous best mv as the
    // starting point (best reference) for the search.
    first_pass_motion_search(cpi, x, &ref_mv, &mv, &motion_error);

    // If the current best reference mv is not centered on 0,0 then do a
    // 0,0 based search as well.
    if ((fp_sf->skip_zeromv_motion_search == 0) && !is_zero_mv(&ref_mv)) {
      FULLPEL_MV tmp_mv = kZeroFullMv;
      int tmp_err = INT_MAX;
      first_pass_motion_search(cpi, x, &kZeroMv, &tmp_mv, &tmp_err);

      if (tmp_err < motion_error) {
        motion_error = tmp_err;
        mv = tmp_mv;
      }
    }
  }

  // Motion search in 2nd reference frame.
  int gf_motion_error = motion_error;
  if ((current_frame->frame_number > 1) && golden_frame != NULL) {
    FULLPEL_MV tmp_mv = kZeroFullMv;
    // Assume 0,0 motion with no mv overhead.
    av1_setup_pre_planes(xd, 0, golden_frame, 0, 0, NULL, 1);
    xd->plane[0].pre[0].buf += recon_yoffset;
    gf_motion_error =
        get_prediction_error_bitdepth(is_high_bitdepth, bitdepth, bsize,
                                      &x->plane[0].src, &xd->plane[0].pre[0]);
    first_pass_motion_search(cpi, x, &kZeroMv, &tmp_mv, &gf_motion_error);
  }
  if (gf_motion_error < motion_error && gf_motion_error < this_intra_error) {
    ++stats->second_ref_count;
  }
  // In accumulating a score for the 2nd reference frame take the
  // best of the motion predicted score and the intra coded error
  // (just as will be done for) accumulation of "coded_error" for
  // the last frame.
  if ((current_frame->frame_number > 1) && golden_frame != NULL) {
    stats->sr_coded_error += AOMMIN(gf_motion_error, this_intra_error);
  } else {
    // TODO(chengchen): I believe logically this should also be changed to
    // stats->sr_coded_error += AOMMIN(gf_motion_error, this_intra_error).
    stats->sr_coded_error += motion_error;
  }

  // Reset to last frame as reference buffer.
  xd->plane[0].pre[0].buf = last_frame->y_buffer + recon_yoffset;
  if (av1_num_planes(&cpi->common) > 1) {
    xd->plane[1].pre[0].buf = last_frame->u_buffer + recon_uvoffset;
    xd->plane[2].pre[0].buf = last_frame->v_buffer + recon_uvoffset;
  }

  // Start by assuming that intra mode is best.
  *best_mv = kZeroMv;

  if (motion_error <= this_intra_error) {
    // Keep a count of cases where the inter and intra were very close
    // and very low. This helps with scene cut detection for example in
    // cropped clips with black bars at the sides or top and bottom.
    if (((this_intra_error - INTRA_MODE_PENALTY) * 9 <= motion_error * 10) &&
        (this_intra_error < (2 * INTRA_MODE_PENALTY))) {
      stats->neutral_count += 1.0;
      // Also track cases where the intra is not much worse than the inter
      // and use this in limiting the GF/arf group length.
    } else if ((this_intra_error > NCOUNT_INTRA_THRESH) &&
               (this_intra_error < (NCOUNT_INTRA_FACTOR * motion_error))) {
      stats->neutral_count +=
          (double)motion_error / DOUBLE_DIVIDE_CHECK((double)this_intra_error);
    }

    *best_mv = get_mv_from_fullmv(&mv);
    this_inter_error = motion_error;
    xd->mi[0]->mode = NEWMV;
    xd->mi[0]->mv[0].as_mv = *best_mv;
    xd->mi[0]->tx_size = TX_4X4;
    xd->mi[0]->ref_frame[0] = LAST_FRAME;
    xd->mi[0]->ref_frame[1] = NONE_FRAME;

    if (fp_sf->disable_recon == 0) {
      av1_enc_build_inter_predictor(cm, xd, unit_row * unit_scale,
                                    unit_col * unit_scale, NULL, bsize,
                                    AOM_PLANE_Y, AOM_PLANE_Y);
      av1_encode_sby_pass1(cpi, x, bsize);
    }
    stats->sum_mvr += best_mv->row;
    stats->sum_mvr_abs += abs(best_mv->row);
    stats->sum_mvc += best_mv->col;
    stats->sum_mvc_abs += abs(best_mv->col);
    stats->sum_mvrs += best_mv->row * best_mv->row;
    stats->sum_mvcs += best_mv->col * best_mv->col;
    ++stats->inter_count;

    accumulate_mv_stats(*best_mv, mv, unit_row, unit_col, unit_rows, unit_cols,
                        last_non_zero_mv, stats);
  }

  return this_inter_error;
}